

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

void __thiscall
QHttp2ProtocolHandler::connectionError
          (QHttp2ProtocolHandler *this,Http2Error errorCode,QString *message)

{
  QHttpNetworkConnectionChannel *this_00;
  int *piVar1;
  QDebug this_01;
  NetworkError error;
  QLoggingCategory *pQVar2;
  char *message_00;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 local_5c;
  char *local_58;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar2->field_2).bools.enabledCritical._q_value._M_base._M_i & 1U) != 0) {
    local_58 = pQVar2->name;
    local_70 = 2;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    local_5c = 0;
    QMessageLogger::critical();
    this_01.stream = local_50.stream;
    QVar4.m_data = (storage_type *)0x11;
    QVar4.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    pcVar3 = (message->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_50,(ulong)pcVar3);
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QDebug::~QDebug(&local_50);
  }
  error = Http2::qt_error(errorCode);
  this_00 = *(QHttpNetworkConnectionChannel **)(this + 0x18);
  QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)(message->d).ptr);
  message_00 = (char *)CONCAT44(uStack_64,uStack_68);
  if (message_00 == (char *)0x0) {
    message_00 = (char *)&QByteArray::_empty;
  }
  QHttpNetworkConnectionChannel::emitFinishedWithError(this_00,error,message_00);
  piVar1 = (int *)CONCAT44(uStack_6c,local_70);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      error = ConnectionRefusedError;
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),1,0x10);
    }
  }
  QHttpNetworkConnectionChannel::close(*(QHttpNetworkConnectionChannel **)(this + 0x18),error);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::connectionError(Http2::Http2Error errorCode, const QString &message)
{
    Q_ASSERT(!message.isNull());

    qCCritical(QT_HTTP2) << "connection error:" << message;

    const auto error = qt_error(errorCode);
    m_channel->emitFinishedWithError(error, qPrintable(message));

    closeSession();
}